

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

vector<CScript,_std::allocator<CScript>_> * __thiscall
anon_unknown.dwarf_1461ac2::MultiADescriptor::MakeScripts
          (vector<CScript,_std::allocator<CScript>_> *__return_storage_ptr__,MultiADescriptor *this,
          vector<CPubKey,_std::allocator<CPubKey>_> *keys,Span<const_CScript> param_2,
          FlatSigningProvider *param_3)

{
  uint uVar1;
  pointer pCVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  void *pvVar6;
  pointer pXVar7;
  pointer pXVar8;
  ulong uVar9;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar10;
  uint uVar11;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar12;
  CPubKey *key;
  pointer __args;
  long lVar13;
  vector<CPubKey,_std::allocator<CPubKey>_> *__range2;
  long in_FS_OFFSET;
  vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_> xkeys;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_> local_78;
  allocator_type local_59;
  undefined1 local_58 [28];
  uint uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._16_8_ = 0;
  stack0xffffffffffffffc0 = 0;
  local_58._0_8_ = (char *)0x0;
  local_58._8_8_ = 0;
  local_78.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
  super__Vector_impl_data._M_start = (XOnlyPubKey *)0x0;
  local_78.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
  super__Vector_impl_data._M_finish = (XOnlyPubKey *)0x0;
  local_78.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (XOnlyPubKey *)0x0;
  std::vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>::reserve
            (&local_78,
             ((long)(keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
                   super__Vector_impl_data._M_start) * 0xfc0fc0fc0fc0fc1);
  __args = (keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pCVar2 = (keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (__args != pCVar2) {
    do {
      if (local_78.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_78.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<XOnlyPubKey,std::allocator<XOnlyPubKey>>::_M_realloc_insert<CPubKey_const&>
                  ((vector<XOnlyPubKey,std::allocator<XOnlyPubKey>> *)&local_78,
                   (iterator)
                   local_78.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
                   super__Vector_impl_data._M_finish,__args);
      }
      else {
        uVar3 = *(undefined8 *)(__args->vch + 1);
        uVar4 = *(undefined8 *)(__args->vch + 9);
        uVar5 = *(undefined8 *)(__args->vch + 0x19);
        *(undefined8 *)
         (((local_78.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
            super__Vector_impl_data._M_finish)->m_keydata).super_base_blob<256U>.m_data._M_elems +
         0x10) = *(undefined8 *)(__args->vch + 0x11);
        *(undefined8 *)
         (((local_78.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
            super__Vector_impl_data._M_finish)->m_keydata).super_base_blob<256U>.m_data._M_elems +
         0x18) = uVar5;
        *(undefined8 *)
         ((local_78.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
           super__Vector_impl_data._M_finish)->m_keydata).super_base_blob<256U>.m_data._M_elems =
             uVar3;
        *(undefined8 *)
         (((local_78.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
            super__Vector_impl_data._M_finish)->m_keydata).super_base_blob<256U>.m_data._M_elems + 8
         ) = uVar4;
        local_78.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_78.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      __args = __args + 1;
    } while (__args != pCVar2);
  }
  pXVar8 = local_78.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pXVar7 = local_78.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_sorted != false) &&
     (local_78.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_78.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    uVar9 = (long)local_78.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_78.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
                  super__Vector_impl_data._M_start >> 5;
    lVar13 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar13 == 0; lVar13 = lVar13 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<XOnlyPubKey*,std::vector<XOnlyPubKey,std::allocator<XOnlyPubKey>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_78.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_78.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<XOnlyPubKey*,std::vector<XOnlyPubKey,std::allocator<XOnlyPubKey>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pXVar7,pXVar8);
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_90,
             (uchar *)local_78.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl
                      .super__Vector_impl_data._M_start,
             (uchar *)(local_78.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>.
                       _M_impl.super__Vector_impl_data._M_start + 1),&local_59);
  ppVar10 = &CScript::operator<<((CScript *)local_58,&local_90)->super_CScriptBase;
  uVar1 = ppVar10->_size;
  uVar11 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar11 = uVar1;
  }
  ppVar12 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar10->_union).indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    ppVar12 = ppVar10;
  }
  local_59 = (allocator_type)0xac;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar10,(uchar *)((long)&ppVar12->_union + (long)(int)uVar11),(uchar *)&local_59);
  pvVar6 = (void *)CONCAT71(local_90.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._1_7_,
                            local_90.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._0_1_);
  if (pvVar6 != (void *)0x0) {
    operator_delete(pvVar6,(long)local_90.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar6);
  }
  if (1 < (ulong)(((long)(keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
                        super__Vector_impl_data._M_start) * 0xfc0fc0fc0fc0fc1)) {
    uVar9 = 1;
    lVar13 = 0x20;
    do {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_90,
                 ((local_78.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
                   super__Vector_impl_data._M_start)->m_keydata).super_base_blob<256U>.m_data.
                 _M_elems + lVar13,
                 local_78.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
                 super__Vector_impl_data._M_start[1].m_keydata.super_base_blob<256U>.m_data._M_elems
                 + lVar13,&local_59);
      ppVar10 = &CScript::operator<<((CScript *)local_58,&local_90)->super_CScriptBase;
      uVar1 = ppVar10->_size;
      uVar11 = uVar1 - 0x1d;
      if (uVar1 < 0x1d) {
        uVar11 = uVar1;
      }
      ppVar12 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                (ppVar10->_union).indirect_contents.indirect;
      if (uVar1 < 0x1d) {
        ppVar12 = ppVar10;
      }
      local_59 = (allocator_type)0xba;
      prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                (ppVar10,(uchar *)((long)&ppVar12->_union + (long)(int)uVar11),(uchar *)&local_59);
      pvVar6 = (void *)CONCAT71(local_90.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._1_7_,
                                local_90.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_1_);
      if (pvVar6 != (void *)0x0) {
        operator_delete(pvVar6,(long)local_90.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar6);
      }
      uVar9 = uVar9 + 1;
      lVar13 = lVar13 + 0x20;
    } while (uVar9 < (ulong)(((long)(keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>).
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>).
                                   _M_impl.super__Vector_impl_data._M_start) * 0xfc0fc0fc0fc0fc1));
  }
  ppVar10 = &CScript::push_int64((CScript *)local_58,(long)this->m_threshold)->super_CScriptBase;
  uVar1 = ppVar10->_size;
  uVar11 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar11 = uVar1;
  }
  ppVar12 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar10->_union).indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    ppVar12 = ppVar10;
  }
  local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = (vector<unsigned_char,std::allocator<unsigned_char>>)0x9c
  ;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar10,(uchar *)((long)&ppVar12->_union + (long)(int)uVar11),(uchar *)&local_90);
  (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CScript,_std::allocator<CScript>_>::reserve(__return_storage_ptr__,1);
  std::vector<CScript,_std::allocator<CScript>_>::emplace_back<CScript>
            (__return_storage_ptr__,(CScript *)local_58);
  if (local_78.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
      super__Vector_impl_data._M_start != (XOnlyPubKey *)0x0) {
    operator_delete(local_78.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (0x1c < uStack_3c) {
    free((void *)local_58._0_8_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CScript> MakeScripts(const std::vector<CPubKey>& keys, Span<const CScript>, FlatSigningProvider&) const override {
        CScript ret;
        std::vector<XOnlyPubKey> xkeys;
        xkeys.reserve(keys.size());
        for (const auto& key : keys) xkeys.emplace_back(key);
        if (m_sorted) std::sort(xkeys.begin(), xkeys.end());
        ret << ToByteVector(xkeys[0]) << OP_CHECKSIG;
        for (size_t i = 1; i < keys.size(); ++i) {
            ret << ToByteVector(xkeys[i]) << OP_CHECKSIGADD;
        }
        ret << m_threshold << OP_NUMEQUAL;
        return Vector(std::move(ret));
    }